

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O0

int nn_literal_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                      size_t *resultlen)

{
  FILE *pFVar1;
  char *pcVar2;
  uint *puVar3;
  undefined2 *in_RCX;
  int in_EDX;
  size_t in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  in6_addr in6addr;
  in_addr inaddr;
  char addrz [46];
  int rc;
  int in_stack_ffffffffffffff5c;
  undefined8 local_7c;
  undefined8 local_74;
  undefined4 local_6c;
  char local_68 [52];
  int local_34;
  undefined8 *local_30;
  undefined2 *local_28;
  int local_1c;
  size_t local_18;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  if ((in_RSI == 0) || (*in_RDI != '[')) {
    if (0x2e < in_RSI + 1) {
      return -0x16;
    }
    memcpy(local_68,in_RDI,in_RSI);
    local_68[local_18] = '\0';
  }
  else {
    if (in_RDI[in_RSI - 1] != ']') {
      return -0x16;
    }
    if (0x2e < in_RSI - 1) {
      return -0x16;
    }
    memcpy(local_68,in_RDI + 1,in_RSI - 2);
    local_68[local_18 - 2] = '\0';
  }
  if (local_1c == 0) {
    local_34 = inet_pton(10,local_68,&local_7c);
    if (local_34 == 1) {
      if (local_28 != (undefined2 *)0x0) {
        *local_28 = 10;
        *(undefined8 *)(local_28 + 4) = local_7c;
        *(undefined8 *)(local_28 + 8) = local_74;
      }
      if (local_30 != (undefined8 *)0x0) {
        *local_30 = 0x1c;
      }
      return 0;
    }
    if (local_34 != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      __errno_location();
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffff5c);
      puVar3 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/utils/literal.c"
              ,0x4a);
      fflush(_stderr);
      nn_err_abort();
    }
    local_34 = 0;
  }
  local_34 = inet_pton(2,local_68,&local_6c);
  if (local_34 == 1) {
    if (local_28 != (undefined2 *)0x0) {
      *local_28 = 2;
      *(undefined4 *)(local_28 + 2) = local_6c;
    }
    if (local_30 != (undefined8 *)0x0) {
      *local_30 = 0x10;
    }
    local_4 = 0;
  }
  else {
    if (local_34 != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      __errno_location();
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffff5c);
      puVar3 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/utils/literal.c"
              ,0x58);
      fflush(_stderr);
      nn_err_abort();
    }
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int nn_literal_resolve (const char *addr, size_t addrlen,
    int ipv4only, struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;
    char addrz [INET6_ADDRSTRLEN > INET_ADDRSTRLEN ?
        INET6_ADDRSTRLEN :  INET_ADDRSTRLEN];
    struct in_addr inaddr;
    struct in6_addr in6addr;

    /*  Try to treat the address as a literal string. If the size of
        the address is larger than longest possible literal, skip the step.
        If the literal in enclosed in square brackets ignore them. */
    if (addrlen > 0 && addr [0] == '[') {
        if (addr [addrlen - 1] != ']')
            return -EINVAL;
        if (addrlen - 2 + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr + 1, addrlen - 2);
        addrz [addrlen - 2] = 0;
    }
    else {
        if (addrlen + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr, addrlen);
        addrz [addrlen] = 0;
    }

    /*  Try to interpret the literal as an IPv6 address. */
    if (!ipv4only) {
        rc = inet_pton (AF_INET6, addrz, &in6addr);
        if (rc == 1) {
            if (result) {
                result->ss_family = AF_INET6;
                ((struct sockaddr_in6*) result)->sin6_addr = in6addr;
             }
             if (resultlen)
                *resultlen = sizeof (struct sockaddr_in6);
            return 0;
        }
        errno_assert (rc == 0);
    }

    /*  Try to interpret the literal as an IPv4 address. */
    rc = inet_pton (AF_INET, addrz, &inaddr);
    if (rc == 1) {
        if (result) {
           result->ss_family = AF_INET;
           ((struct sockaddr_in*) result)->sin_addr = inaddr;
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in);
        return 0;
    }
    errno_assert (rc == 0);

    /*  The supplied string is not a valid literal address. */
    return -EINVAL;
}